

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryEmitGeometryShaderTests.cpp
# Opt level: O1

TestCaseGroup * vkt::geometry::createEmitGeometryShaderTests(TestContext *testCtx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long *plVar4;
  undefined8 *puVar5;
  TestNode *node;
  ulong *puVar6;
  long *plVar7;
  ulong uVar8;
  long lVar9;
  string *this;
  ostringstream s;
  ulong *local_ab0;
  long local_aa8;
  ulong local_aa0;
  long lStack_a98;
  ulong *local_a90;
  long local_a88;
  ulong local_a80;
  long lStack_a78;
  ulong *local_a70;
  long local_a68;
  ulong local_a60;
  long lStack_a58;
  long *local_a50;
  long local_a48;
  long local_a40;
  long lStack_a38;
  ulong *local_a30;
  long local_a28;
  ulong local_a20;
  long lStack_a18;
  ulong *local_a10;
  long local_a08;
  ulong local_a00 [2];
  ulong *local_9f0;
  long local_9e8;
  ulong local_9e0 [2];
  TestNode *local_9d0;
  ulong *local_9c8;
  long local_9c0;
  ulong local_9b8 [2];
  TestContext *local_9a8;
  string *local_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined4 local_988;
  undefined1 *local_980 [2];
  undefined1 local_970 [16];
  undefined1 *local_960 [2];
  undefined1 local_950 [16];
  undefined4 local_940;
  undefined4 uStack_93c;
  undefined4 uStack_938;
  undefined4 uStack_934;
  undefined4 local_930;
  undefined1 *local_928 [2];
  undefined1 local_918 [16];
  undefined1 *local_908 [2];
  undefined1 local_8f8 [16];
  undefined4 local_8e8;
  undefined4 uStack_8e4;
  undefined4 uStack_8e0;
  undefined4 uStack_8dc;
  undefined4 local_8d8;
  undefined1 *local_8d0 [2];
  undefined1 local_8c0 [16];
  undefined1 *local_8b0 [2];
  undefined1 local_8a0 [16];
  undefined4 local_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined4 local_880;
  undefined1 *local_878 [2];
  undefined1 local_868 [16];
  undefined1 *local_858 [2];
  undefined1 local_848 [16];
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined4 local_828;
  undefined1 *local_820 [2];
  undefined1 local_810 [16];
  undefined1 *local_800 [2];
  undefined1 local_7f0 [16];
  undefined4 local_7e0;
  undefined8 local_7dc;
  undefined8 uStack_7d4;
  undefined1 *local_7c8 [2];
  undefined1 local_7b8 [16];
  undefined1 *local_7a8 [2];
  undefined1 local_798 [16];
  undefined4 local_788;
  undefined4 uStack_784;
  undefined4 uStack_780;
  undefined4 uStack_77c;
  undefined4 local_778;
  undefined1 *local_770 [2];
  undefined1 local_760 [16];
  undefined1 *local_750 [2];
  undefined1 local_740 [16];
  undefined4 local_730;
  undefined4 uStack_72c;
  undefined4 uStack_728;
  undefined4 uStack_724;
  undefined4 local_720;
  undefined1 *local_718 [2];
  undefined1 local_708 [16];
  undefined1 *local_6f8 [2];
  undefined1 local_6e8 [16];
  undefined4 local_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  undefined4 local_6c8;
  undefined1 *local_6c0 [2];
  undefined1 local_6b0 [16];
  undefined1 *local_6a0 [2];
  undefined1 local_690 [16];
  undefined4 local_680;
  undefined4 uStack_67c;
  undefined4 uStack_678;
  undefined4 uStack_674;
  undefined4 local_670;
  undefined1 *local_668 [2];
  undefined1 local_658 [16];
  undefined1 *local_648 [2];
  undefined1 local_638 [16];
  undefined4 local_628;
  undefined4 uStack_624;
  undefined4 uStack_620;
  undefined4 uStack_61c;
  undefined4 local_618;
  undefined1 *local_610 [2];
  undefined1 local_600 [16];
  undefined1 *local_5f0 [2];
  undefined1 local_5e0 [16];
  undefined4 local_5d0;
  undefined4 uStack_5cc;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  undefined4 local_5c0;
  undefined1 *local_5b8 [2];
  undefined1 local_5a8 [16];
  undefined1 *local_598 [2];
  undefined1 local_588 [16];
  undefined4 local_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 local_568;
  undefined1 *local_560 [2];
  undefined1 local_550 [16];
  undefined1 *local_540 [2];
  undefined1 local_530 [16];
  undefined4 local_520;
  undefined8 local_51c;
  undefined8 uStack_514;
  undefined1 *local_508 [2];
  undefined1 local_4f8 [16];
  undefined1 *local_4e8 [2];
  undefined1 local_4d8 [16];
  undefined4 local_4c8;
  undefined4 uStack_4c4;
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  undefined4 local_4b8;
  undefined1 *local_4b0 [2];
  undefined1 local_4a0 [16];
  undefined1 *local_490 [2];
  undefined1 local_480 [16];
  undefined4 local_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined4 local_460;
  undefined1 *local_458 [2];
  undefined1 local_448 [16];
  undefined1 *local_438 [2];
  undefined1 local_428 [16];
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 local_408;
  undefined1 *local_400 [2];
  undefined1 local_3f0 [16];
  undefined1 *local_3e0 [2];
  undefined1 local_3d0 [16];
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 local_3b0;
  undefined1 *local_3a8 [2];
  undefined1 local_398 [16];
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  undefined4 local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  undefined4 local_358;
  undefined1 *local_350 [2];
  undefined1 local_340 [16];
  undefined1 *local_330 [2];
  undefined1 local_320 [16];
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined4 local_300;
  undefined1 *local_2f8 [2];
  undefined1 local_2e8 [16];
  undefined1 *local_2d8 [2];
  undefined1 local_2c8 [16];
  undefined4 local_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 local_2a8;
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 local_250;
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined4 local_1f8;
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  long *local_1d0 [2];
  long local_1c0 [3];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_9d0 = (TestNode *)operator_new(0x70);
  local_9a8 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_9d0,testCtx,"emit","Different emit counts.");
  local_980[0] = local_970;
  local_998 = 0;
  uStack_990 = 0;
  local_988 = 0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_980,"points","");
  this = (string *)local_960;
  local_960[0] = local_950;
  std::__cxx11::string::_M_construct<char_const*>(this,"");
  local_940 = 0;
  uStack_93c = 0;
  uStack_938 = 1;
  uStack_934 = 0;
  local_930 = 0;
  local_928[0] = local_918;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_928,"points","");
  local_908[0] = local_8f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_908,"");
  local_8e8 = 0;
  uStack_8e4 = 1;
  uStack_8e0 = 1;
  uStack_8dc = 0;
  local_8d8 = 0;
  local_8d0[0] = local_8c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8d0,"points","");
  local_8b0[0] = local_8a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8b0,"");
  local_890 = 0;
  uStack_88c = 0;
  uStack_888 = 2;
  uStack_884 = 0;
  local_880 = 0;
  local_878[0] = local_868;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_878,"points","");
  local_858[0] = local_848;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_858,"");
  local_838 = 0;
  uStack_834 = 1;
  uStack_830 = 2;
  uStack_82c = 0;
  local_828 = 0;
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"points","");
  local_800[0] = local_7f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"");
  local_7e0 = 2;
  local_7c8[0] = local_7b8;
  local_7dc = 0;
  uStack_7d4 = 0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"line_strip","");
  local_7a8[0] = local_798;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"");
  local_788 = 2;
  uStack_784 = 0;
  uStack_780 = 1;
  uStack_77c = 0;
  local_778 = 0;
  local_770[0] = local_760;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_770,"line_strip","");
  local_750[0] = local_740;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"");
  local_730 = 2;
  uStack_72c = 1;
  uStack_728 = 1;
  uStack_724 = 0;
  local_720 = 0;
  local_718[0] = local_708;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"line_strip","");
  local_6f8[0] = local_6e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"");
  local_6d8 = 2;
  uStack_6d4 = 2;
  uStack_6d0 = 1;
  uStack_6cc = 0;
  local_6c8 = 0;
  local_6c0[0] = local_6b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6c0,"line_strip","");
  local_6a0[0] = local_690;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"");
  local_680 = 2;
  uStack_67c = 0;
  uStack_678 = 2;
  uStack_674 = 0;
  local_670 = 0;
  local_668[0] = local_658;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_668,"line_strip","");
  local_648[0] = local_638;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_648,"");
  local_628 = 2;
  uStack_624 = 1;
  uStack_620 = 2;
  uStack_61c = 0;
  local_618 = 0;
  local_610[0] = local_600;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"line_strip","");
  local_5f0[0] = local_5e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"");
  local_5d0 = 2;
  uStack_5cc = 2;
  uStack_5c8 = 2;
  uStack_5c4 = 0;
  local_5c0 = 0;
  local_5b8[0] = local_5a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"line_strip","");
  local_598[0] = local_588;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"");
  local_578 = 2;
  uStack_574 = 2;
  uStack_570 = 2;
  uStack_56c = 2;
  local_568 = 0;
  local_560[0] = local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_560,"line_strip","");
  local_540[0] = local_530;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"");
  local_520 = 4;
  local_508[0] = local_4f8;
  local_51c = 0;
  uStack_514 = 0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"triangle_strip","");
  local_4e8[0] = local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"");
  local_4c8 = 4;
  uStack_4c4 = 0;
  uStack_4c0 = 1;
  uStack_4bc = 0;
  local_4b8 = 0;
  local_4b0[0] = local_4a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"triangle_strip","");
  local_490[0] = local_480;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"");
  local_470 = 4;
  uStack_46c = 1;
  uStack_468 = 1;
  uStack_464 = 0;
  local_460 = 0;
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"triangle_strip","");
  local_438[0] = local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"");
  local_418 = 4;
  uStack_414 = 2;
  uStack_410 = 1;
  uStack_40c = 0;
  local_408 = 0;
  local_400[0] = local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"triangle_strip","");
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"");
  local_3c0 = 4;
  uStack_3bc = 3;
  uStack_3b8 = 1;
  uStack_3b4 = 0;
  local_3b0 = 0;
  local_3a8[0] = local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"triangle_strip","");
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"");
  local_368 = 4;
  uStack_364 = 0;
  uStack_360 = 2;
  uStack_35c = 0;
  local_358 = 0;
  local_350[0] = local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"triangle_strip","");
  local_330[0] = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"");
  local_310 = 4;
  uStack_30c = 1;
  uStack_308 = 2;
  uStack_304 = 0;
  local_300 = 0;
  local_2f8[0] = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"triangle_strip","");
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"");
  local_2b8 = 4;
  uStack_2b4 = 2;
  uStack_2b0 = 2;
  uStack_2ac = 0;
  local_2a8 = 0;
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"triangle_strip","");
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"");
  local_260 = 4;
  uStack_25c = 3;
  uStack_258 = 2;
  uStack_254 = 0;
  local_250 = 0;
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"triangle_strip","");
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"");
  local_208 = 4;
  uStack_204 = 3;
  uStack_200 = 2;
  uStack_1fc = 3;
  local_1f8 = 0;
  local_1f0[0] = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"triangle_strip","");
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"");
  lVar9 = 0x17;
  do {
    local_a30 = &local_a20;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a30,*(long *)(this + -0x20),
               *(long *)(this + -0x18) + *(long *)(this + -0x20));
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_a30);
    local_a90 = &local_a80;
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_a80 = *puVar6;
      lStack_a78 = plVar4[3];
    }
    else {
      local_a80 = *puVar6;
      local_a90 = (ulong *)*plVar4;
    }
    local_a88 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,*(int *)(this + -0x34));
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_a90 != &local_a80) {
      uVar8 = local_a80;
    }
    if (uVar8 < (ulong)(local_a08 + local_a88)) {
      uVar8 = 0xf;
      if (local_a10 != local_a00) {
        uVar8 = local_a00[0];
      }
      if (uVar8 < (ulong)(local_a08 + local_a88)) goto LAB_00a01c92;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a10,0,(char *)0x0,(ulong)local_a90);
    }
    else {
LAB_00a01c92:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a90,(ulong)local_a10);
    }
    local_a70 = &local_a60;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_a60 = *puVar6;
      lStack_a58 = puVar5[3];
    }
    else {
      local_a60 = *puVar6;
      local_a70 = (ulong *)*puVar5;
    }
    local_a68 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)puVar6 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_a70);
    local_ab0 = &local_aa0;
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_aa0 = *puVar6;
      lStack_a98 = plVar4[3];
    }
    else {
      local_aa0 = *puVar6;
      local_ab0 = (ulong *)*plVar4;
    }
    local_aa8 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,*(int *)(this + -0x30));
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_ab0 != &local_aa0) {
      uVar8 = local_aa0;
    }
    if (uVar8 < (ulong)(local_9e8 + local_aa8)) {
      uVar8 = 0xf;
      if (local_9f0 != local_9e0) {
        uVar8 = local_9e0[0];
      }
      if (uVar8 < (ulong)(local_9e8 + local_aa8)) goto LAB_00a01dee;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_9f0,0,(char *)0x0,(ulong)local_ab0);
    }
    else {
LAB_00a01dee:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_ab0,(ulong)local_9f0);
    }
    local_a50 = &local_a40;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_a40 = *plVar4;
      lStack_a38 = puVar5[3];
    }
    else {
      local_a40 = *plVar4;
      local_a50 = (long *)*puVar5;
    }
    local_a48 = puVar5[1];
    *puVar5 = plVar4;
    local_9a0 = this + -0x20;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    std::__cxx11::string::operator=(local_9a0,(string *)&local_a50);
    if (local_a50 != &local_a40) {
      operator_delete(local_a50,local_a40 + 1);
    }
    if (local_9f0 != local_9e0) {
      operator_delete(local_9f0,local_9e0[0] + 1);
    }
    if (local_ab0 != &local_aa0) {
      operator_delete(local_ab0,local_aa0 + 1);
    }
    if (local_a70 != &local_a60) {
      operator_delete(local_a70,local_a60 + 1);
    }
    if (local_a10 != local_a00) {
      operator_delete(local_a10,local_a00[0] + 1);
    }
    if (local_a90 != &local_a80) {
      operator_delete(local_a90,local_a80 + 1);
    }
    if (local_a30 != &local_a20) {
      operator_delete(local_a30,local_a20 + 1);
    }
    local_a10 = local_a00;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a10,*(long *)(this + -0x20),
               *(long *)(this + -0x18) + *(long *)(this + -0x20));
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_a10);
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_a20 = *puVar6;
      lStack_a18 = plVar4[3];
      local_a30 = &local_a20;
    }
    else {
      local_a20 = *puVar6;
      local_a30 = (ulong *)*plVar4;
    }
    local_a28 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,*(int *)(this + -0x34));
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_a30 != &local_a20) {
      uVar8 = local_a20;
    }
    if (uVar8 < (ulong)(local_9e8 + local_a28)) {
      uVar8 = 0xf;
      if (local_9f0 != local_9e0) {
        uVar8 = local_9e0[0];
      }
      if (uVar8 < (ulong)(local_9e8 + local_a28)) goto LAB_00a0206c;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_9f0,0,(char *)0x0,(ulong)local_a30);
    }
    else {
LAB_00a0206c:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a30,(ulong)local_9f0);
    }
    local_a90 = &local_a80;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_a80 = *puVar6;
      lStack_a78 = puVar5[3];
    }
    else {
      local_a80 = *puVar6;
      local_a90 = (ulong *)*puVar5;
    }
    local_a88 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)puVar6 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_a90);
    local_a70 = &local_a60;
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_a60 = *puVar6;
      lStack_a58 = plVar4[3];
    }
    else {
      local_a60 = *puVar6;
      local_a70 = (ulong *)*plVar4;
    }
    local_a68 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,*(int *)(this + -0x30));
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_a70 != &local_a60) {
      uVar8 = local_a60;
    }
    if (uVar8 < (ulong)(local_9c0 + local_a68)) {
      uVar8 = 0xf;
      if (local_9c8 != local_9b8) {
        uVar8 = local_9b8[0];
      }
      if (uVar8 < (ulong)(local_9c0 + local_a68)) goto LAB_00a021cb;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_9c8,0,(char *)0x0,(ulong)local_a70);
    }
    else {
LAB_00a021cb:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a70,(ulong)local_9c8);
    }
    local_ab0 = &local_aa0;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_aa0 = *puVar6;
      lStack_a98 = puVar5[3];
    }
    else {
      local_aa0 = *puVar6;
      local_ab0 = (ulong *)*puVar5;
    }
    local_aa8 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)puVar6 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_ab0);
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_a40 = *plVar7;
      lStack_a38 = plVar4[3];
      local_a50 = &local_a40;
    }
    else {
      local_a40 = *plVar7;
      local_a50 = (long *)*plVar4;
    }
    local_a48 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=(this,(string *)&local_a50);
    if (local_a50 != &local_a40) {
      operator_delete(local_a50,local_a40 + 1);
    }
    if (local_ab0 != &local_aa0) {
      operator_delete(local_ab0,local_aa0 + 1);
    }
    if (local_9c8 != local_9b8) {
      operator_delete(local_9c8,local_9b8[0] + 1);
    }
    if (local_a70 != &local_a60) {
      operator_delete(local_a70,local_a60 + 1);
    }
    if (local_a90 != &local_a80) {
      operator_delete(local_a90,local_a80 + 1);
    }
    if (local_9f0 != local_9e0) {
      operator_delete(local_9f0,local_9e0[0] + 1);
    }
    if (local_a30 != &local_a20) {
      operator_delete(local_a30,local_a20 + 1);
    }
    if (local_a10 != local_a00) {
      operator_delete(local_a10,local_a00[0] + 1);
    }
    if (*(int *)(this + -0x2c) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,*(int *)(this + -0x2c));
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_a90,0,(char *)0x0,0xb9e16c);
      local_a70 = &local_a60;
      puVar6 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar6) {
        local_a60 = *puVar6;
        lStack_a58 = plVar4[3];
      }
      else {
        local_a60 = *puVar6;
        local_a70 = (ulong *)*plVar4;
      }
      local_a68 = plVar4[1];
      *plVar4 = (long)puVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_a70);
      local_ab0 = &local_aa0;
      puVar6 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar6) {
        local_aa0 = *puVar6;
        lStack_a98 = plVar4[3];
      }
      else {
        local_aa0 = *puVar6;
        local_ab0 = (ulong *)*plVar4;
      }
      local_aa8 = plVar4[1];
      *plVar4 = (long)puVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,*(int *)(this + -0x28));
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar8 = 0xf;
      if (local_ab0 != &local_aa0) {
        uVar8 = local_aa0;
      }
      if (uVar8 < (ulong)(local_a28 + local_aa8)) {
        uVar8 = 0xf;
        if (local_a30 != &local_a20) {
          uVar8 = local_a20;
        }
        if (uVar8 < (ulong)(local_a28 + local_aa8)) goto LAB_00a0252b;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_a30,0,(char *)0x0,(ulong)local_ab0);
      }
      else {
LAB_00a0252b:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_ab0,(ulong)local_a30);
      }
      local_a50 = &local_a40;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_a40 = *plVar4;
        lStack_a38 = puVar5[3];
      }
      else {
        local_a40 = *plVar4;
        local_a50 = (long *)*puVar5;
      }
      local_a48 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      std::__cxx11::string::_M_append((char *)local_9a0,(ulong)local_a50);
      if (local_a50 != &local_a40) {
        operator_delete(local_a50,local_a40 + 1);
      }
      if (local_a30 != &local_a20) {
        operator_delete(local_a30,local_a20 + 1);
      }
      if (local_ab0 != &local_aa0) {
        operator_delete(local_ab0,local_aa0 + 1);
      }
      if (local_a70 != &local_a60) {
        operator_delete(local_a70,local_a60 + 1);
      }
      if (local_a90 != &local_a80) {
        operator_delete(local_a90,local_a80 + 1);
      }
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,*(int *)(this + -0x2c));
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_a30,0,(char *)0x0,0xb9e180)
      ;
      local_a90 = &local_a80;
      puVar6 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar6) {
        local_a80 = *puVar6;
        lStack_a78 = puVar5[3];
      }
      else {
        local_a80 = *puVar6;
        local_a90 = (ulong *)*puVar5;
      }
      local_a88 = puVar5[1];
      *puVar5 = puVar6;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_a90);
      local_a70 = &local_a60;
      puVar6 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar6) {
        local_a60 = *puVar6;
        lStack_a58 = plVar4[3];
      }
      else {
        local_a60 = *puVar6;
        local_a70 = (ulong *)*plVar4;
      }
      local_a68 = plVar4[1];
      *plVar4 = (long)puVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,*(int *)(this + -0x28));
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar8 = 0xf;
      if (local_a70 != &local_a60) {
        uVar8 = local_a60;
      }
      if (uVar8 < (ulong)(local_a08 + local_a68)) {
        uVar8 = 0xf;
        if (local_a10 != local_a00) {
          uVar8 = local_a00[0];
        }
        if (uVar8 < (ulong)(local_a08 + local_a68)) goto LAB_00a027d2;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_a10,0,(char *)0x0,(ulong)local_a70);
      }
      else {
LAB_00a027d2:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a70,(ulong)local_a10);
      }
      local_ab0 = &local_aa0;
      puVar6 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar6) {
        local_aa0 = *puVar6;
        lStack_a98 = puVar5[3];
      }
      else {
        local_aa0 = *puVar6;
        local_ab0 = (ulong *)*puVar5;
      }
      local_aa8 = puVar5[1];
      *puVar5 = puVar6;
      puVar5[1] = 0;
      *(undefined1 *)puVar6 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_ab0);
      local_a50 = &local_a40;
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_a40 = *plVar7;
        lStack_a38 = plVar4[3];
      }
      else {
        local_a40 = *plVar7;
        local_a50 = (long *)*plVar4;
      }
      local_a48 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)this,(ulong)local_a50);
      if (local_a50 != &local_a40) {
        operator_delete(local_a50,local_a40 + 1);
      }
      if (local_ab0 != &local_aa0) {
        operator_delete(local_ab0,local_aa0 + 1);
      }
      if (local_a10 != local_a00) {
        operator_delete(local_a10,local_a00[0] + 1);
      }
      if (local_a70 != &local_a60) {
        operator_delete(local_a70,local_a60 + 1);
      }
      if (local_a90 != &local_a80) {
        operator_delete(local_a90,local_a80 + 1);
      }
      if (local_a30 != &local_a20) {
        operator_delete(local_a30,local_a20 + 1);
      }
    }
    node = (TestNode *)operator_new(200);
    tcu::TestCase::TestCase((TestCase *)node,local_9a8,*(char **)(this + -0x20),*(char **)this);
    node->_vptr_TestNode = (_func_int **)&PTR__EmitTest_00d7e468;
    uVar1 = *(undefined4 *)(this + -0x34);
    uVar2 = *(undefined4 *)(this + -0x30);
    uVar3 = *(undefined4 *)(this + -0x2c);
    *(undefined4 *)&node[1]._vptr_TestNode = *(undefined4 *)(this + -0x38);
    *(undefined4 *)((long)&node[1]._vptr_TestNode + 4) = uVar1;
    *(undefined4 *)&node[1].m_testCtx = uVar2;
    *(undefined4 *)((long)&node[1].m_testCtx + 4) = uVar3;
    *(undefined4 *)&node[1].m_name._M_dataplus._M_p = *(undefined4 *)(this + -0x28);
    node[1].m_name._M_string_length = (size_type)((long)&node[1].m_name.field_2 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&node[1].m_name._M_string_length,*(long *)(this + -0x20),
               *(long *)(this + -0x18) + *(long *)(this + -0x20));
    node[1].m_description._M_string_length = (size_type)((long)&node[1].m_description.field_2 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&node[1].m_description._M_string_length,*(long *)this,
               *(long *)(this + 8) + *(long *)this);
    tcu::TestNode::addChild(local_9d0,node);
    this = this + 0x58;
    lVar9 = lVar9 + -1;
    if (lVar9 == 0) {
      lVar9 = -0x7e8;
      plVar4 = local_1c0;
      do {
        if (plVar4 != (long *)plVar4[-2]) {
          operator_delete((long *)plVar4[-2],*plVar4 + 1);
        }
        if (plVar4 + -4 != (long *)plVar4[-6]) {
          operator_delete((long *)plVar4[-6],plVar4[-4] + 1);
        }
        plVar4 = plVar4 + -0xb;
        lVar9 = lVar9 + 0x58;
      } while (lVar9 != 0);
      return (TestCaseGroup *)local_9d0;
    }
  } while( true );
}

Assistant:

TestCaseGroup* createEmitGeometryShaderTests (TestContext& testCtx)
{
	MovePtr<TestCaseGroup> emitGroup	(new TestCaseGroup(testCtx, "emit", "Different emit counts."));

	// emit different amounts
	{
		EmitTestSpec emitTests[] =
		{
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		0,	0,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		0,	1,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		1,	1,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		0,	2,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		1,	2,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		0,	0,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		0,	1,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		1,	1,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		2,	1,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		0,	2,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		1,	2,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		2,	2,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		2,	2,	2,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	0,	0,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	0,	1,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	1,	1,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	2,	1,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	3,	1,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	0,	2,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	1,	2,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	2,	2,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	3,	2,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	3,	2,	3,	0,	"triangle_strip",	""},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(emitTests); ++ndx)
		{
			emitTests[ndx].name = std::string(emitTests[ndx].name) + "_emit_" + de::toString(emitTests[ndx].emitCountA) + "_end_" + de::toString(emitTests[ndx].endCountA);
			emitTests[ndx].desc = std::string(emitTests[ndx].name) + " output, emit " + de::toString(emitTests[ndx].emitCountA) + " vertices, call EndPrimitive " + de::toString(emitTests[ndx].endCountA) + " times";

			if (emitTests[ndx].emitCountB)
			{
				emitTests[ndx].name += "_emit_" + de::toString(emitTests[ndx].emitCountB) + "_end_" + de::toString(emitTests[ndx].endCountB);
				emitTests[ndx].desc += ", emit " + de::toString(emitTests[ndx].emitCountB) + " vertices, call EndPrimitive " + de::toString(emitTests[ndx].endCountB) + " times";
			}

			emitGroup->addChild(new EmitTest(testCtx, emitTests[ndx]));
		}
	}

	return emitGroup.release();
}